

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::clear_recursive(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                  *this,node *n)

{
  bool bVar1;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *in_RSI;
  node *in_stack_00000008;
  unsigned_short slot_1;
  inner_node *innernode;
  uint slot;
  leaf_node *leafnode;
  ushort local_2a;
  uint local_1c;
  node *in_stack_ffffffffffffffe8;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *this_00;
  
  bVar1 = node::isleafnode((node *)in_RSI);
  if (bVar1) {
    for (local_1c = 0; local_1c < *(unsigned_short *)((long)&in_RSI->m_root + 2);
        local_1c = local_1c + 1) {
    }
  }
  else {
    this_00 = in_RSI;
    for (local_2a = 0; (uint)local_2a < *(unsigned_short *)((long)&in_RSI->m_root + 2) + 1;
        local_2a = local_2a + 1) {
      clear_recursive(this_00,in_stack_ffffffffffffffe8);
      free_node((btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                 *)innernode,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void clear_recursive(node *n)
        {
            if (n->isleafnode())
            {
                leaf_node *leafnode = static_cast<leaf_node*>(n);

                for (unsigned int slot = 0; slot < leafnode->slotuse; ++slot)
                {
                    // data objects are deleted by leaf_node's destructor
                }
            }
            else
            {
                inner_node *innernode = static_cast<inner_node*>(n);

                for (unsigned short slot = 0; slot < innernode->slotuse + 1; ++slot)
                {
                    clear_recursive(innernode->childid[slot]);
                    free_node(innernode->childid[slot]);
                }
            }
        }